

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O0

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,Joint *joint)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  SpatialVector_t *pSVar4;
  SpatialVector_t *pSVar5;
  long in_RSI;
  undefined8 *in_RDI;
  uint i;
  SpatialVector_t *in_stack_ffffffffffffffa8;
  SpatialVector_t *in_stack_ffffffffffffffb0;
  SpatialVector_t *local_48;
  uint local_20;
  
  *(undefined4 *)(in_RDI + 1) = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)((long)in_RDI + 0xc) = *(undefined4 *)(in_RSI + 0xc);
  *(undefined4 *)(in_RDI + 2) = *(undefined4 *)(in_RSI + 0x10);
  *(undefined4 *)((long)in_RDI + 0x14) = *(undefined4 *)(in_RSI + 0x14);
  uVar2 = CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x30),0);
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pSVar4 = (SpatialVector_t *)operator_new__(uVar3);
  if (uVar2 != 0) {
    in_stack_ffffffffffffffb0 = pSVar4 + uVar2;
    local_48 = pSVar4;
    do {
      SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x85b921);
      pSVar5 = local_48 + 1;
      in_stack_ffffffffffffffa8 = local_48;
      local_48 = pSVar5;
    } while (pSVar5 != in_stack_ffffffffffffffb0);
  }
  *in_RDI = pSVar4;
  for (local_20 = 0; local_20 < *(uint *)((long)in_RDI + 0xc); local_20 = local_20 + 1) {
    SpatialVector_t::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

Joint (const Joint &joint) :
    mJointType (joint.mJointType),
    mDoFCount (joint.mDoFCount),
    q_index (joint.q_index),
    custom_joint_index(joint.custom_joint_index)
  {
    mJointAxes = new Math::SpatialVector[mDoFCount];

    for (unsigned int i = 0; i < mDoFCount; i++) {
      mJointAxes[i] = joint.mJointAxes[i];
    }
  }